

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

bool __thiscall Engine::constrain(Engine *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Lit p_00;
  uint uVar4;
  type tVar5;
  int *piVar6;
  long lVar7;
  long in_RDI;
  bool done;
  Lit p;
  FlatZincSpace *fzn;
  Engine *in_stack_000000b0;
  FlatZincSpace *in_stack_000000b8;
  int in_stack_0000016c;
  Connector *in_stack_00000170;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff58;
  long *plVar8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff60;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff68;
  SAT *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  long local_78;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  int local_48;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  iVar3 = IntVar::getVal((IntVar *)0x287a65);
  *(int *)(in_RDI + 0x84) = iVar3;
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
            (in_stack_ffffffffffffff58);
  tVar5 = std::chrono::operator-
                    ((duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff70);
  *(rep *)(in_RDI + 0x108) = tVar5.__r;
  if ((so.sbps & 1U) != 0) {
    saveCurrentSolution((Engine *)in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_RDI + 0x68) == 0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(*(long *)(in_RDI + 0x68),&Problem::typeinfo,
                              &FlatZinc::FlatZincSpace::typeinfo,0);
  }
  if (local_78 != 0) {
    FlatZinc::FlatZincSpace::storeSolution
              ((FlatZincSpace *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  SAT::btToLevel(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  *(int *)(in_RDI + 0x144) = *(int *)(in_RDI + 0x144) + 1;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  bVar1 = doProfiling();
  if (bVar1) {
    cpprofiler::Connector::restart(in_stack_00000170,in_stack_0000016c);
  }
  if ((so.lazy & 1U) == 0) {
    if (*(int *)(in_RDI + 0x80) == 0) {
      plVar8 = *(long **)(in_RDI + 0x78);
      lVar7 = (long)(*(int *)(in_RDI + 0x84) + -1);
      Reason::Reason((Reason *)&local_58,(Clause *)0x0);
      bVar2 = (**(code **)(*plVar8 + 0x78))(plVar8,lVar7,local_58._pt,1);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        return false;
      }
    }
    else {
      plVar8 = *(long **)(in_RDI + 0x78);
      lVar7 = (long)(*(int *)(in_RDI + 0x84) + 1);
      Reason::Reason((Reason *)&local_50,(Clause *)0x0);
      bVar2 = (**(code **)(*plVar8 + 0x70))(plVar8,lVar7,local_50._pt,1);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        return false;
      }
    }
  }
  else {
    if (*(int *)(in_RDI + 0x80) == 0) {
      p_00.x = (**(code **)(**(long **)(in_RDI + 0x78) + 0x68))
                         (*(long **)(in_RDI + 0x78),(long)(*(int *)(in_RDI + 0x84) + -1),3);
    }
    else {
      p_00.x = (**(code **)(**(long **)(in_RDI + 0x78) + 0x68))
                         (*(long **)(in_RDI + 0x78),(long)(*(int *)(in_RDI + 0x84) + 1),2);
    }
    uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x50));
    if (uVar4 == 0) {
      local_44 = p_00.x;
      toInt(p_00);
      vec<int>::push((vec<int> *)in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
    }
    else {
      local_48 = p_00.x;
      iVar3 = toInt(p_00);
      piVar6 = vec<int>::last((vec<int> *)(in_RDI + 0x50));
      *piVar6 = iVar3;
    }
  }
  if ((local_78 == 0) ||
     (bVar1 = FlatZinc::FlatZincSpace::onRestart(in_stack_000000b8,in_stack_000000b0), !bVar1)) {
    if ((so.mip & 1U) != 0) {
      MIP::setObjective(mip,*(int *)(in_RDI + 0x84));
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool Engine::constrain() {
	best_sol = opt_var->getVal();
	opt_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time) - init_time;

	// Solution-based phase saving
	if (so.sbps) {
		saveCurrentSolution();
	}
	auto* fzn = dynamic_cast<FlatZinc::FlatZincSpace*>(problem);
	if (fzn != nullptr) {
		fzn->storeSolution();
	}

	sat.btToLevel(0);
	restart_count++;
	nodepath.resize(0);
	altpath.resize(0);
	/* nextnodeid = 0; */
#ifdef HAS_PROFILER
	if (doProfiling()) {
		profilerConnector->restart(restart_count);
	}
#endif

	//  printf("opt_var = %d, opt_type = %d, best_sol = %d\n", opt_var->var_id, opt_type, best_sol);
	//  printf("%% opt_var min = %d, opt_var max = %d\n", opt_var->getMin(), opt_var->getMax());

	if (so.lazy) {
		const Lit p =
				opt_type != 0 ? opt_var->getLit(best_sol + 1, LR_GE) : opt_var->getLit(best_sol - 1, LR_LE);
		// GKG: Preserves existing assumptions, but assumes we've reserved
		// space at the end for the objective bound.
		if (assumptions.size() == 0) {
			assumptions.push(toInt(p));
		} else {
			assumptions.last() = toInt(p);
		}
	} else {
		// Special-case, since get-lit breaks if lazy is false.
		if (opt_type != 0) {  // maximize
			if (!opt_var->setMin(best_sol + 1)) {
				return false;
			}
		} else {
			if (!opt_var->setMax(best_sol - 1)) {
				return false;
			}
		}
	}

	if (fzn != nullptr) {
		const bool done = fzn->onRestart(this);
		if (done) {
			return false;
		}
	}

	if (so.mip) {
		mip->setObjective(best_sol);
	}

	/* return (opt_type ? opt_var->setMin(best_sol+1) : opt_var->setMax(best_sol-1)); */
	return true;
}